

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

void __thiscall
BackwardPass::ClearBucketsOnFieldKill<ObjTypeGuardBucket>
          (BackwardPass *this,Instr *instr,
          HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *table)

{
  Opnd *this_00;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  undefined4 *puVar4;
  
  if (table != (HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *)0x0) {
    bVar2 = IR::Instr::UsesAllFields(instr);
    if (bVar2) {
      HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator>::ClearAll(table);
      return;
    }
    this_00 = instr->m_dst;
    if (this_00 != (Opnd *)0x0) {
      OVar3 = IR::Opnd::GetKind(this_00);
      if (OVar3 == OpndKindReg) {
        OVar3 = IR::Opnd::GetKind(this_00);
        if (OVar3 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar4 = 0;
        }
        HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator>::Clear
                  (table,*(int *)(this_00[1]._vptr_Opnd + 2));
        return;
      }
    }
  }
  return;
}

Assistant:

void
BackwardPass::ClearBucketsOnFieldKill(IR::Instr *instr, HashTable<T> *table)
{
    if (table)
    {
        if (instr->UsesAllFields())
        {
            table->ClearAll();
        }
        else
        {
            IR::Opnd *dst = instr->GetDst();
            if (dst && dst->IsRegOpnd())
            {
                table->Clear(dst->AsRegOpnd()->m_sym->m_id);
            }
        }
    }
}